

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int statesize_00;
  uint uVar1;
  uint8 *nodes_00;
  uint32 cond_00;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  iterator pcVar5;
  iterator pcVar6;
  byte *pbVar7;
  int local_2f0;
  int local_2ec;
  int i_4;
  int i_3;
  uint32 matchcond_1;
  int i_2;
  uint32 nextindex;
  uint32 cond;
  uint32 matchcond;
  int c;
  uint32 nextmatchcond;
  bool matched;
  char *p;
  char *ep;
  char *bp;
  uint8 *bytemap;
  uint32 statesize;
  uint8 *nodes;
  OneState *state;
  StringPiece context;
  byte *pbStack_278;
  int i_1;
  char *matchcap [10];
  int local_21c;
  byte *pbStack_218;
  int i;
  char *cap [10];
  int ncap;
  LogMessage local_1b8;
  StringPiece *local_38;
  StringPiece *match_local;
  MatchKind kind_local;
  Anchor anchor_local;
  StringPiece *const_context_local;
  StringPiece *text_local;
  Prog *this_local;
  
  local_38 = match;
  match_local._0_4_ = kind;
  match_local._4_4_ = anchor;
  _kind_local = const_context;
  const_context_local = text;
  text_local = (StringPiece *)this;
  if ((anchor == kAnchored) || (kind == kFullMatch)) {
    cap[9]._0_4_ = nmatch << 1;
    if ((int)cap[9] < 2) {
      cap[9]._0_4_ = 2;
    }
    for (local_21c = 0; local_21c < (int)cap[9]; local_21c = local_21c + 1) {
      cap[(long)local_21c + -1] = (char *)0x0;
    }
    for (context._12_4_ = 0; (int)context._12_4_ < (int)cap[9]; context._12_4_ = context._12_4_ + 1)
    {
      matchcap[(long)(int)context._12_4_ + -1] = (char *)0x0;
    }
    state = (OneState *)_kind_local->ptr_;
    context.ptr_ = *(char **)&_kind_local->length_;
    pcVar5 = StringPiece::begin((StringPiece *)&state);
    if (pcVar5 == (iterator)0x0) {
      state = (OneState *)const_context_local->ptr_;
      context.ptr_ = (char *)CONCAT44(context.ptr_._4_4_,const_context_local->length_);
    }
    bVar2 = anchor_start(this);
    if (bVar2) {
      pcVar5 = StringPiece::begin((StringPiece *)&state);
      pcVar6 = StringPiece::begin(const_context_local);
      if (pcVar5 != pcVar6) {
        return false;
      }
    }
    bVar2 = anchor_end(this);
    if (bVar2) {
      pcVar5 = StringPiece::end((StringPiece *)&state);
      pcVar6 = StringPiece::end(const_context_local);
      if (pcVar5 != pcVar6) {
        return false;
      }
    }
    bVar2 = anchor_end(this);
    if (bVar2) {
      match_local._0_4_ = kFullMatch;
    }
    nodes = (uint8 *)this->onepass_start_;
    nodes_00 = this->onepass_nodes_;
    statesize_00 = this->onepass_statesize_;
    _nextmatchcond = (byte *)StringPiece::begin(const_context_local);
    pbVar7 = (byte *)StringPiece::end(const_context_local);
    bVar2 = false;
    pbStack_278 = _nextmatchcond;
    pbStack_218 = _nextmatchcond;
    matchcond = ((OneState *)nodes)->matchcond;
    for (; cond_00 = matchcond, _nextmatchcond < pbVar7; _nextmatchcond = _nextmatchcond + 1) {
      uVar1 = *(uint *)(nodes + (long)(int)(uint)this->bytemap_[(int)(uint)*_nextmatchcond] * 4 + 4)
      ;
      if (((uVar1 & 0x3f) == 0) ||
         (bVar3 = Satisfy(uVar1,(StringPiece *)&state,(char *)_nextmatchcond), bVar3)) {
        nodes = (uint8 *)IndexToNode(nodes_00,statesize_00,uVar1 >> 0x10);
        matchcond = ((OneState *)nodes)->matchcond;
      }
      else {
        nodes = (uint8 *)0x0;
        matchcond = 0x30;
      }
      if (((((MatchKind)match_local != kFullMatch) && (cond_00 != 0x30)) &&
          (((uVar1 & 0x40) != 0 || ((matchcond & 0x3f) != 0)))) &&
         (((cond_00 & 0x3f) == 0 ||
          (bVar3 = Satisfy(cond_00,(StringPiece *)&state,(char *)_nextmatchcond), bVar3)))) {
        for (i_3 = 2; SBORROW4(i_3,nmatch * 2) != i_3 + nmatch * -2 < 0; i_3 = i_3 + 1) {
          matchcap[(long)i_3 + -1] = cap[(long)i_3 + -1];
        }
        if ((1 < nmatch) && ((cond_00 & 0x7f80) != 0)) {
          ApplyCaptures(cond_00,(char *)_nextmatchcond,(char **)&stack0xfffffffffffffd88,(int)cap[9]
                       );
        }
        matchcap[0] = (char *)_nextmatchcond;
        bVar2 = true;
        if (((MatchKind)match_local == kFirstMatch) && ((uVar1 & 0x40) != 0)) goto LAB_00173b5d;
      }
      if (nodes == (uint8 *)0x0) goto LAB_00173b5d;
      if (((uVar1 & 0x7f80) != 0) && (1 < nmatch)) {
        ApplyCaptures(uVar1,(char *)_nextmatchcond,(char **)&stack0xfffffffffffffde8,(int)cap[9]);
      }
    }
    uVar1 = *(uint *)nodes;
    if ((uVar1 != 0x30) &&
       (((uVar1 & 0x3f) == 0 ||
        (bVar3 = Satisfy(uVar1,(StringPiece *)&state,(char *)_nextmatchcond), bVar3)))) {
      if ((1 < nmatch) && ((uVar1 & 0x7f80) != 0)) {
        ApplyCaptures(uVar1,(char *)_nextmatchcond,(char **)&stack0xfffffffffffffde8,(int)cap[9]);
      }
      for (local_2ec = 2; local_2ec < (int)cap[9]; local_2ec = local_2ec + 1) {
        matchcap[(long)local_2ec + -1] = cap[(long)local_2ec + -1];
      }
      matchcap[0] = (char *)_nextmatchcond;
      bVar2 = true;
    }
LAB_00173b5d:
    if (bVar2) {
      for (local_2f0 = 0; local_2f0 < nmatch; local_2f0 = local_2f0 + 1) {
        StringPiece::set(local_38 + local_2f0,matchcap[(long)(local_2f0 << 1) + -1],
                         (int)matchcap[(long)(local_2f0 * 2 + 1) + -1] -
                         (int)matchcap[(long)(local_2f0 << 1) + -1]);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc",
               0xd0);
    poVar4 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar4,"Cannot use SearchOnePass for unanchored matches.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  if (anchor_start() && context.begin() != text.begin())
    return false;
  if (anchor_end() && context.end() != text.end())
    return false;
  if (anchor_end())
    kind = kFullMatch;

  // State and act are marked volatile to
  // keep the compiler from re-ordering the
  // memory accesses walking over the NFA.
  // This is worth about 5%.
  volatile OneState* state = onepass_start_;
  volatile uint8* nodes = onepass_nodes_;
  volatile uint32 statesize = onepass_statesize_;
  uint8* bytemap = bytemap_;
  const char* bp = text.begin();
  const char* ep = text.end();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32 nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32 matchcond = nextmatchcond;
    uint32 cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32 nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32 matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i].set(matchcap[2*i],
                 static_cast<int>(matchcap[2*i+1] - matchcap[2*i]));
  return true;
}